

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

shared_ptr<gui::DialogBox> __thiscall
gui::DialogBox::create(DialogBox *this,shared_ptr<gui::DialogBoxStyle> *style,String *name)

{
  DialogBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::DialogBox> sVar1;
  __shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (DialogBox *)operator_new(0x278);
  std::__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>);
  DialogBox(this_00,(shared_ptr<gui::DialogBoxStyle> *)&local_40,name);
  std::__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::DialogBox,void>
            ((__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::DialogBox>)
         sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DialogBox> DialogBox::create(std::shared_ptr<DialogBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<DialogBox>(new DialogBox(style, name));
}